

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inherit.cc
# Opt level: O1

void QueryHandler2(string *query)

{
  pointer pcVar1;
  LogText *extraout_RAX;
  LogText *extraout_RAX_00;
  LogText *this;
  LogText *pLVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  LogText logger;
  string local_a8;
  LogText local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88.lines_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88.lines_;
  local_88.super_ThreadCapture<LogText>._vptr_ThreadCapture = (_func_int **)&PTR__LogText_00104d80;
  local_88.lines_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_88.type_ = kNew;
  local_88.capture_to_.previous_ = *(LogText **)(in_FS_OFFSET + -8);
  pLVar2 = &local_88;
  *(LogText **)(in_FS_OFFSET + -8) = pLVar2;
  local_88.lines_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_88.lines_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_88.capture_to_.current_ = pLVar2;
  std::operator+(&local_50,"QueryHandler2 called: ",query);
  LogText::Log(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (query->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + query->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  QueryHandler1(&local_a8);
  this = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
    this = extraout_RAX_00;
  }
  if ((local_88.type_ == kInherit) && (local_88.capture_to_.previous_ != (LogText *)0x0)) {
    pLVar2 = LogText::Delegate(this);
  }
  p_Var4 = (_List_node_base *)&pLVar2->lines_;
  while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&pLVar2->lines_) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Available from QueryHandler2: \"",0x1f);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_88.super_ThreadCapture<LogText>._vptr_ThreadCapture = (_func_int **)&PTR__LogText_00104d80;
  *(LogText **)(in_FS_OFFSET + -8) = local_88.capture_to_.previous_;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_88.lines_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

void QueryHandler2(const std::string& query) {
  LogText logger(LogText::InheritType::kNew);
  LogText::Log("QueryHandler2 called: " + query);
  QueryHandler1(query + "!!!");
  for (const auto& line : logger.GetLines()) {
    std::cerr << "Available from QueryHandler2: \"" << line << "\""
              << std::endl;
  }
}